

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.hpp
# Opt level: O0

size_t Lodtalk::variableSlotDivisor(ObjectFormat format)

{
  size_t sStack_10;
  ObjectFormat format_local;
  
  switch(format) {
  case OF_INDEXABLE_64:
    sStack_10 = 1;
    break;
  case OF_INDEXABLE_32:
  case OF_INDEXABLE_32_1:
    sStack_10 = 2;
    break;
  case OF_INDEXABLE_16:
  case OF_INDEXABLE_16_1:
  case OF_INDEXABLE_16_2:
  case OF_INDEXABLE_16_3:
    sStack_10 = 4;
    break;
  case OF_INDEXABLE_8:
  case OF_INDEXABLE_8_1:
  case OF_INDEXABLE_8_2:
  case OF_INDEXABLE_8_3:
  case OF_INDEXABLE_8_4:
  case OF_INDEXABLE_8_5:
  case OF_INDEXABLE_8_6:
  case OF_INDEXABLE_8_7:
  case OF_COMPILED_METHOD:
  case OF_COMPILED_METHOD_1:
  case OF_COMPILED_METHOD_2:
  case OF_COMPILED_METHOD_3:
  case OF_COMPILED_METHOD_4:
  case OF_COMPILED_METHOD_5:
  case OF_COMPILED_METHOD_6:
  case OF_COMPILED_METHOD_7:
    sStack_10 = 8;
    break;
  default:
    abort();
  }
  return sStack_10;
}

Assistant:

inline size_t variableSlotDivisor(ObjectFormat format)
{
#ifdef OBJECT_MODEL_SPUR_64
	switch(format)
	{
	case OF_INDEXABLE_64:
		return 1;
	case OF_INDEXABLE_32:
	case OF_INDEXABLE_32_1:
		return 2;
	case OF_INDEXABLE_16:
	case OF_INDEXABLE_16_1:
	case OF_INDEXABLE_16_2:
	case OF_INDEXABLE_16_3:
		return 4;
	case OF_INDEXABLE_8:
	case OF_INDEXABLE_8_1:
	case OF_INDEXABLE_8_2:
	case OF_INDEXABLE_8_3:
	case OF_INDEXABLE_8_4:
	case OF_INDEXABLE_8_5:
	case OF_INDEXABLE_8_6:
	case OF_INDEXABLE_8_7:
	case OF_COMPILED_METHOD:
	case OF_COMPILED_METHOD_1:
	case OF_COMPILED_METHOD_2:
	case OF_COMPILED_METHOD_3:
	case OF_COMPILED_METHOD_4:
	case OF_COMPILED_METHOD_5:
	case OF_COMPILED_METHOD_6:
	case OF_COMPILED_METHOD_7:
		return 8;
	default: abort();
	}
#else
	switch(format)
	{
	case OF_INDEXABLE_32:
	case OF_INDEXABLE_32_1:
		return 1;
	case OF_INDEXABLE_16:
	case OF_INDEXABLE_16_1:
	case OF_INDEXABLE_16_2:
	case OF_INDEXABLE_16_3:
		return 2;
	case OF_INDEXABLE_8:
	case OF_INDEXABLE_8_1:
	case OF_INDEXABLE_8_2:
	case OF_INDEXABLE_8_3:
	case OF_INDEXABLE_8_4:
	case OF_INDEXABLE_8_5:
	case OF_INDEXABLE_8_6:
	case OF_INDEXABLE_8_7:
	case OF_COMPILED_METHOD:
	case OF_COMPILED_METHOD_1:
	case OF_COMPILED_METHOD_2:
	case OF_COMPILED_METHOD_3:
	case OF_COMPILED_METHOD_4:
	case OF_COMPILED_METHOD_5:
	case OF_COMPILED_METHOD_6:
	case OF_COMPILED_METHOD_7:
		return 4;
	default: abort();
	}
#endif
}